

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O1

void __thiscall VRle::Data::opIntersect(Data *this,VRect *r,VRleSpanCb cb,void *userData)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  long lVar10;
  ushort uVar11;
  uint16_t uVar12;
  int iVar13;
  Span *pSVar14;
  int iVar15;
  pointer pSVar16;
  pointer pSVar17;
  pointer pSVar18;
  Result result;
  Span local_828 [255];
  
  if ((this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    updateBbox(this);
    uVar6 = (this->mBbox).x1;
    uVar8 = (this->mBbox).y1;
    if ((((r->x1 <= (int)uVar6) &&
         (uVar7 = (this->mBbox).x2, uVar9 = (this->mBbox).y2, (int)uVar7 <= r->x2)) &&
        (r->y1 <= (int)uVar8)) && ((int)uVar9 <= r->y2)) {
      pSVar14 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*cb)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl
                  .super__Vector_impl_data._M_finish - (long)pSVar14 >> 3,pSVar14,userData);
      return;
    }
    pSVar18 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar16 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
              super__Vector_impl_data._M_finish;
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&local_828[0].y + lVar10 + 1) = 0;
      *(undefined4 *)((long)&local_828[0].x + lVar10) = 0;
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x7f8);
    while ((long)pSVar16 - (long)pSVar18 != 0) {
      pSVar16 = (pointer)(((long)pSVar16 - (long)pSVar18) + (long)pSVar18);
      iVar2 = r->x1;
      iVar3 = r->y1;
      iVar4 = r->x2;
      iVar5 = r->y2;
      lVar10 = 0xff;
      pSVar14 = local_828;
      pSVar17 = pSVar18;
      do {
        pSVar18 = pSVar17;
        if ((lVar10 == 0) || (pSVar16 <= pSVar17)) break;
        sVar1 = pSVar17->y;
        iVar15 = (int)sVar1;
        pSVar18 = pSVar16;
        if (iVar15 < iVar5) {
          if (iVar3 <= iVar15) {
            iVar13 = (int)pSVar17->x;
            if ((iVar13 < iVar4) && (iVar2 < (int)((uint)pSVar17->len + iVar13))) {
              if (iVar13 < iVar2) {
                iVar13 = (iVar13 - iVar2) + (uint)pSVar17->len;
                uVar12 = (uint16_t)iVar13;
                if (iVar4 - iVar2 < iVar13) {
                  uVar12 = (uint16_t)(iVar4 - iVar2);
                }
                pSVar14->len = uVar12;
                pSVar14->x = (short)iVar2;
              }
              else {
                pSVar14->x = pSVar17->x;
                uVar11 = (short)iVar4 - pSVar17->x;
                if (pSVar17->len <= uVar11) {
                  uVar11 = pSVar17->len;
                }
                pSVar14->len = uVar11;
              }
              if (pSVar14->len != 0) {
                pSVar14->y = sVar1;
                pSVar14->coverage = pSVar17->coverage;
                pSVar14 = pSVar14 + 1;
                lVar10 = lVar10 + -1;
              }
            }
          }
          pSVar18 = pSVar17 + 1;
        }
        pSVar17 = pSVar18;
      } while (iVar15 < iVar5);
      if (lVar10 != 0xff) {
        (*cb)(0xff - lVar10,local_828,userData);
      }
    }
  }
  return;
}

Assistant:

void VRle::Data::opIntersect(const VRect &r, VRle::VRleSpanCb cb,
                             void *userData) const
{
    if (empty()) return;

    if (r.contains(bbox())) {
        cb(mSpans.size(), mSpans.data(), userData);
        return;
    }

    auto   obj = view();
    Result result;
    // run till all the spans are processed
    while (obj.size()) {
        auto count = _opIntersect(r, obj, result);
        if (count) cb(count, result.data(), userData);
    }
}